

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

Variable * __thiscall
soul::HEARTGenerator::createVariableDeclaration
          (HEARTGenerator *this,VariableDeclaration *v,Role role,bool canBeReference)

{
  Module *this_00;
  bool bVar1;
  Variable *o;
  Expression *e;
  Expression *o_00;
  StringDictionary *dictionary;
  Annotation *this_01;
  Annotation local_c0;
  pool_ptr<soul::heart::Expression> local_90;
  pool_ptr<soul::heart::Variable> local_88;
  string *local_80;
  Identifier local_78 [3];
  byte local_59;
  Type local_58;
  Type local_40;
  Variable *local_28;
  Variable *av;
  bool canBeReference_local;
  VariableDeclaration *pVStack_18;
  Role role_local;
  VariableDeclaration *v_local;
  HEARTGenerator *this_local;
  
  this_00 = this->module;
  local_59 = 0;
  av._3_1_ = canBeReference;
  av._4_4_ = role;
  pVStack_18 = v;
  v_local = (VariableDeclaration *)this;
  if (canBeReference) {
    AST::VariableDeclaration::getType(&local_40,v);
  }
  else {
    AST::VariableDeclaration::getType(&local_58,v);
    local_59 = 1;
    Type::removeReferenceIfPresent(&local_40,&local_58);
  }
  local_80 = (pVStack_18->name).name;
  local_78[0] = convertIdentifier(this,local_80);
  o = Module::
      allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                (this_00,&(v->super_Statement).super_ASTObject.context.location,&local_40,local_78,
                 (Role *)((long)&av + 4));
  Type::~Type(&local_40);
  if ((local_59 & 1) != 0) {
    Type::~Type(&local_58);
  }
  local_28 = o;
  pool_ptr<soul::heart::Variable>::pool_ptr<soul::heart::Variable,void>(&local_88,o);
  (pVStack_18->generatedVariable).object = local_88.object;
  pool_ptr<soul::heart::Variable>::~pool_ptr(&local_88);
  if ((av._4_4_ == state) &&
     (bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&pVStack_18->initialValue,(void *)0x0),
     bVar1)) {
    e = pool_ptr<soul::AST::Expression>::operator*(&pVStack_18->initialValue);
    o_00 = evaluateAsConstantExpression(this,e);
    pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>(&local_90,o_00);
    (local_28->initialValue).object = local_90.object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(&local_90);
  }
  this_01 = &pVStack_18->annotation;
  dictionary = Program::getStringDictionary(&this->module->program);
  AST::Annotation::toPlainAnnotation(&local_c0,this_01,dictionary);
  Annotation::operator=(&local_28->annotation,&local_c0);
  Annotation::~Annotation(&local_c0);
  return local_28;
}

Assistant:

heart::Variable& createVariableDeclaration (AST::VariableDeclaration& v,
                                                heart::Variable::Role role,
                                                bool canBeReference)
    {
        auto& av = module.allocate<heart::Variable> (v.context.location,
                                                     canBeReference ? v.getType() : v.getType().removeReferenceIfPresent(),
                                                     convertIdentifier (v.name), role);
        v.generatedVariable = av;

        if (role == heart::Variable::Role::state && v.initialValue != nullptr)
            av.initialValue = evaluateAsConstantExpression (*v.initialValue);

        av.annotation = v.annotation.toPlainAnnotation (module.program.getStringDictionary());
        return av;
    }